

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

char * helicsTranslatorGetInfo(HelicsTranslator trans)

{
  HelicsTranslator pvVar1;
  string *psVar2;
  
  pvVar1 = (HelicsTranslator)0x0;
  if ((trans != (HelicsTranslator)0x0) && (*(int *)((long)trans + 4) == -0x4c83cad2)) {
    pvVar1 = trans;
  }
  if (pvVar1 == (HelicsTranslator)0x0) {
    psVar2 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar2 = helics::Interface::getInfo_abi_cxx11_(*(Interface **)((long)pvVar1 + 8));
  }
  return (psVar2->_M_dataplus)._M_p;
}

Assistant:

const char* helicsTranslatorGetInfo(HelicsTranslator trans)
{
    auto* transObj = getTranslatorObj(trans, nullptr);
    if (transObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = transObj->transPtr->getInfo();
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}